

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ToastOverlay.cpp
# Opt level: O2

void __thiscall cursespp::ToastOverlay::OnRedraw(ToastOverlay *this)

{
  int iVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  string local_50;
  undefined4 extraout_var;
  
  iVar1 = (*(this->super_OverlayBase).super_LayoutBase.super_Window.super_IWindow.super_IOrderable.
            _vptr_IOrderable[0x23])();
  if ((((char)iVar1 != '\0') && (0 < this->width)) && (0 < this->height)) {
    iVar1 = (*(this->super_OverlayBase).super_LayoutBase.super_Window.super_IWindow.super_IOrderable
              ._vptr_IOrderable[0x22])(this);
    lVar2 = CONCAT44(extraout_var,iVar1);
    lVar3 = 0;
    for (uVar4 = 0;
        (long)uVar4 <
        (long)(int)((ulong)((long)(this->titleLines).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->titleLines).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 5); uVar4 = uVar4 + 1
        ) {
      wmove(lVar2,uVar4 & 0xffffffff,1);
      if (lVar2 != 0) {
        text::Ellipsize(&local_50,
                        (string *)
                        ((long)&(((this->titleLines).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                        lVar3),(long)this->width - 4);
        wprintw(lVar2,"%s",local_50._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&local_50);
      }
      lVar3 = lVar3 + 0x20;
    }
  }
  return;
}

Assistant:

void ToastOverlay::OnRedraw() {
     if (!this->IsVisible() || this->width <= 0 || this->height <= 0) {
         return;
     }

     WINDOW* c = this->GetContent();

     for (int i = 0; i < (int) this->titleLines.size(); i++) {
         wmove(c, i, 1);
         checked_wprintw(c, "%s", text::Ellipsize(this->titleLines[i], this->width - 4).c_str());
     }
}